

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_kernel_c.h
# Opt level: O0

void __thiscall
dlib::queue_kernel_c<dlib::queue_kernel_1<dlib::file,dlib::memory_manager_stateless_kernel_1<char>>>
::remove_any(queue_kernel_c<dlib::queue_kernel_1<dlib::file,dlib::memory_manager_stateless_kernel_1<char>>>
             *this)

{
  T *in_stack_00000248;
  queue_kernel_c<dlib::queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>_>
  *in_stack_00000250;
  
  queue_kernel_c<dlib::queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>_>
  ::remove_any(in_stack_00000250,in_stack_00000248);
  return;
}

Assistant:

void queue_kernel_c<queue_base>::
    remove_any (
        T& item
    ) 
    {
        // make sure requires clause is not broken
        DLIB_CASSERT( (this->size() > 0),
            "\tvoid queue::remove_any"
            << "\n\tsize() must be greater than zero if something is going to be removed"
            << "\n\tsize(): " << this->size() 
            << "\n\tthis:   " << this
            );

        // call the real function
        queue_base::remove_any(item);
    }